

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webm2pes.cc
# Opt level: O1

bool __thiscall
libwebm::PesOptionalHeader::Write(PesOptionalHeader *this,bool write_pts,PacketDataBuffer *buffer)

{
  int iVar1;
  int iVar2;
  uint64_t uVar3;
  bool bVar4;
  long lVar5;
  uint uVar6;
  uint8_t header [9];
  undefined8 local_18;
  undefined1 local_10;
  
  if (buffer == (PacketDataBuffer *)0x0) {
    Write();
  }
  else {
    local_10 = 0;
    local_18 = 0;
    if ((((((((this->marker).num_bits - 1U < 0x40) && (uVar6 = (this->marker).shift, uVar6 < 0x40))
           && ((this->scrambling).num_bits - 1U < 0x40)) &&
          (((uint)(this->scrambling).shift < 0x40 && ((this->priority).num_bits - 1U < 0x40)))) &&
         ((((uint)(this->priority).shift < 0x40 &&
           (((this->data_alignment).num_bits - 1U < 0x40 &&
            ((uint)(this->data_alignment).shift < 0x40)))) &&
          ((this->copyright).num_bits - 1U < 0x40)))) &&
        (((((uint)(this->copyright).shift < 0x40 && ((this->original).num_bits - 1U < 0x40)) &&
          ((uint)(this->original).shift < 0x40)) &&
         ((((this->has_pts).num_bits - 1U < 0x40 && ((uint)(this->has_pts).shift < 0x40)) &&
          (((this->has_dts).num_bits - 1U < 0x40 &&
           (((uint)(this->has_dts).shift < 0x40 && ((this->pts).num_bits - 1U < 0x40)))))))))) &&
       (((uint)(this->pts).shift < 0x40 &&
        (((this->stuffing_byte).num_bits - 1U < 0x40 && ((uint)(this->stuffing_byte).shift < 0x40)))
        ))) {
      local_18._1_1_ = 0;
      if (write_pts) {
        local_18._1_1_ = (byte)((this->has_pts).bits << ((byte)(this->has_pts).shift & 0x3f));
      }
      local_18._1_1_ =
           local_18._1_1_ | (byte)((this->has_dts).bits << ((byte)(this->has_dts).shift & 0x3f));
      local_18._0_3_ =
           CONCAT12((char)(this->remaining_size).bits,
                    CONCAT11(local_18._1_1_,
                             (byte)((this->original).bits << ((byte)(this->original).shift & 0x3f))
                             | (byte)((this->copyright).bits <<
                                     ((byte)(this->copyright).shift & 0x3f)) |
                               (byte)((this->data_alignment).bits <<
                                     ((byte)(this->data_alignment).shift & 0x3f)) |
                               (byte)((this->priority).bits << ((byte)(this->priority).shift & 0x3f)
                                     ) | (byte)((this->scrambling).bits <<
                                               ((byte)(this->scrambling).shift & 0x3f)) |
                                         (byte)((this->marker).bits << ((byte)uVar6 & 0x3f))));
      iVar2 = (this->pts).num_bits;
      iVar1 = iVar2 + 7;
      iVar2 = iVar2 + 0xe;
      if (-1 < iVar1) {
        iVar2 = iVar1;
      }
      if (write_pts) {
        uVar3 = (this->pts).bits;
        local_18 = CONCAT17((char)(uVar3 >> 0x20),
                            CONCAT16((char)(uVar3 >> 0x18),
                                     CONCAT15((char)(uVar3 >> 0x10),
                                              CONCAT14((char)(uVar3 >> 8),
                                                       CONCAT13((char)uVar3,(uint3)local_18)))));
        uVar6 = 1;
        lVar5 = 7;
      }
      else {
        uVar6 = (iVar2 >> 3) + 1;
        lVar5 = 2;
        local_18 = (ulong)(uint3)local_18;
      }
      if (0 < (int)uVar6) {
        memset((void *)((long)&local_18 + lVar5 + 1),(int)(this->stuffing_byte).bits,(ulong)uVar6);
      }
      bVar4 = CopyAndEscapeStartCodes((uint8_t *)&local_18,9,buffer);
      return bVar4;
    }
    Write();
  }
  return false;
}

Assistant:

bool PesOptionalHeader::Write(bool write_pts, PacketDataBuffer* buffer) const {
  if (buffer == nullptr) {
    std::fprintf(stderr, "Webm2Pes: nullptr in opt header writer.\n");
    return false;
  }

  const int kHeaderSize = 9;
  std::uint8_t header[kHeaderSize] = {0};
  std::uint8_t* byte = header;

  if (marker.Check() != true || scrambling.Check() != true ||
      priority.Check() != true || data_alignment.Check() != true ||
      copyright.Check() != true || original.Check() != true ||
      has_pts.Check() != true || has_dts.Check() != true ||
      pts.Check() != true || stuffing_byte.Check() != true) {
    std::fprintf(stderr, "Webm2Pes: Invalid PES Optional Header field.\n");
    return false;
  }

  // TODO(tomfinegan): As noted in above, the PesHeaderFields should be an
  // array (or some data structure) that can be iterated over.

  // First byte of header, fields: marker, scrambling, priority, alignment,
  // copyright, original.
  *byte = 0;
  *byte |= marker.bits << marker.shift;
  *byte |= scrambling.bits << scrambling.shift;
  *byte |= priority.bits << priority.shift;
  *byte |= data_alignment.bits << data_alignment.shift;
  *byte |= copyright.bits << copyright.shift;
  *byte |= original.bits << original.shift;

  // Second byte of header, fields: has_pts, has_dts, unused fields.
  *++byte = 0;
  if (write_pts == true)
    *byte |= has_pts.bits << has_pts.shift;

  *byte |= has_dts.bits << has_dts.shift;

  // Third byte of header, fields: remaining size of header.
  *++byte = remaining_size.bits & 0xff;  // Field is 8 bits wide.

  int num_stuffing_bytes =
      (pts.num_bits + 7) / 8 + 1 /* always 1 stuffing byte */;
  if (write_pts == true) {
    // Write the PTS value as big endian and adjust stuffing byte count
    // accordingly.
    *++byte = pts.bits & 0xff;
    *++byte = (pts.bits >> 8) & 0xff;
    *++byte = (pts.bits >> 16) & 0xff;
    *++byte = (pts.bits >> 24) & 0xff;
    *++byte = (pts.bits >> 32) & 0xff;
    num_stuffing_bytes = 1;
  }

  // Add the stuffing byte(s).
  for (int i = 0; i < num_stuffing_bytes; ++i)
    *++byte = stuffing_byte.bits & 0xff;

  return CopyAndEscapeStartCodes(&header[0], kHeaderSize, buffer);
}